

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O1

void stackjit::ByteCodeGenerator::generateClass(ostream *stream,Class *classDef)

{
  Field *pFVar1;
  char cVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  long *plVar6;
  AttributeContainer *pAVar7;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *pvVar8;
  long *plVar9;
  Field *field;
  Field *this;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"class ",6);
  psVar4 = Loader::Class::name_abi_cxx11_(classDef);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  Loader::Class::parentClassName_abi_cxx11_(&local_50,classDef);
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 == 0) {
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  }
  else {
    Loader::Class::parentClassName_abi_cxx11_(&local_70,classDef);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1241cb);
    local_90 = &local_80;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_80 = *plVar9;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar9;
      local_90 = (long *)*plVar6;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_90,local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((iVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
  cVar2 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  pAVar7 = Loader::Class::attributes_abi_cxx11_(classDef);
  generateAttributes(stream,pAVar7);
  pvVar8 = Loader::Class::fields(classDef);
  pFVar1 = (pvVar8->
           super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this = (pvVar8->
              super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>)
              ._M_impl.super__Vector_impl_data._M_start; this != pFVar1; this = this + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    psVar4 = Loader::Field::name_abi_cxx11_(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    psVar4 = Loader::Field::type_abi_cxx11_(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pAVar7 = Loader::Field::attributes_abi_cxx11_(this);
    generateAttributes(stream,pAVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void ByteCodeGenerator::generateClass(std::ostream& stream, const Loader::Class& classDef) {
		stream << "class " << classDef.name()
			   << (classDef.parentClassName() != "" ? (" extends " + classDef.parentClassName()) : "")
			   << std::endl;
		stream << "{" << std::endl;

		generateAttributes(stream, classDef.attributes());

		for (auto& field : classDef.fields()) {
			stream << "\t" << field.name() << " " << field.type() << std::endl;
			generateAttributes(stream, field.attributes());
		}

		stream << "}" << std::endl;
	}